

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O2

void __thiscall
CountOverJoin::CountOverJoin(CountOverJoin *this,string *pathToFiles,shared_ptr<Launcher> *launcher)

{
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountOverJoin_00152c20;
  std::__cxx11::string::string((string *)&this->_pathToFiles,(string *)pathToFiles);
  std::__shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>,
             &launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>);
  (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Launcher::getDTree((Launcher *)&this->_dTree);
  this->numberOfValues = 0;
  return;
}

Assistant:

CountOverJoin::CountOverJoin(
    const std::string& pathToFiles,std::shared_ptr<Launcher> launcher) : 
    _pathToFiles(pathToFiles), _launcher(launcher), _dTree(launcher->getDTree())
{
}